

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_update_info(bcf_hdr_t *hdr,bcf1_t *line,char *key,void *values,int n,int type)

{
  int *piVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  anon_union_4_2_947300a4_for_v1 aVar5;
  int iVar6;
  bcf_info_t *pbVar7;
  anon_union_4_2_947300a4_for_v1 *paVar8;
  size_t sVar9;
  void *values_00;
  char cVar10;
  ulong uVar11;
  long lVar12;
  byte *pbVar13;
  char *key_00;
  ulong uVar14;
  bcf_info_t *pbVar15;
  void *pvVar16;
  ulong uVar17;
  bcf1_t *line_00;
  uint uVar18;
  uint uVar19;
  bcf_hdr_t *hdr_00;
  byte *pbVar20;
  kstring_t str;
  kstring_t local_48;
  
  uVar4 = n;
  uVar3 = bcf_hdr_id2int(hdr,0,key);
  if ((int)uVar3 < 0) {
    return -1;
  }
  line_00 = (bcf1_t *)(ulong)uVar3;
  if ((~(hdr->id[0][(long)line_00].val)->info[1] & 0xf) == 0) {
    return -1;
  }
  if ((line->unpacked & 4) == 0) {
    bcf_unpack(line,4);
  }
  uVar17 = *(ulong *)&line->field_0x10;
  if ((uVar17 & 0xffff) == 0) {
    uVar11 = 0;
LAB_0011f604:
    if ((uint)uVar11 == ((uint)uVar17 & 0xffff)) {
      pbVar15 = (bcf_info_t *)0x0;
    }
    else {
      pbVar15 = (line->d).info + (uVar11 & 0xffffffff);
    }
  }
  else {
    pbVar7 = (line->d).info;
    pbVar15 = (bcf_info_t *)0x0;
    uVar11 = 0;
    do {
      if (uVar3 == pbVar7->key) goto LAB_0011f604;
      uVar11 = uVar11 + 1;
      pbVar7 = pbVar7 + 1;
    } while ((uVar17 & 0xffff) != uVar11);
  }
  if ((n == 0) ||
     (lVar12 = CONCAT71((int7)(uVar11 >> 8),values != (void *)0x0 || type != 3),
     values == (void *)0x0 && type == 3)) {
    if (pbVar15 == (bcf_info_t *)0x0) {
      return 0;
    }
    if ((int)*(uint *)&pbVar15->field_0x1c < 0) {
      free(pbVar15->vptr + -(ulong)(*(uint *)&pbVar15->field_0x1c & 0x7fffffff));
      pbVar15->field_0x1f = pbVar15->field_0x1f & 0x7f;
    }
    piVar1 = &(line->d).shared_dirty;
    *(byte *)piVar1 = (byte)*piVar1 | 8;
    pbVar15->vptr = (uint8_t *)0x0;
    return 0;
  }
  local_48.l = 0;
  local_48.m = 0;
  local_48.s = (char *)0x0;
  bcf_enc_int1(&local_48,uVar3);
  switch(type) {
  case 0:
  case 3:
    if (values == (void *)0x0) {
      bcf_enc_size(&local_48,0,0);
    }
    else {
      sVar9 = strlen((char *)values);
      bcf_enc_vchar(&local_48,(int)sVar9,(char *)values);
    }
    break;
  case 1:
    bcf_enc_vint(&local_48,n,(int32_t *)values,-1);
    break;
  case 2:
    bcf_enc_vfloat(&local_48,n,(float *)values);
    break;
  default:
    hdr_00 = (bcf_hdr_t *)(ulong)(uint)type;
    bcf_update_info_cold_1();
    if (uVar4 == 0) {
      iVar6 = bcf_update_format(hdr_00,line_00,key_00,(void *)0x0,0,3);
      return iVar6;
    }
    if ((int)uVar4 < 1) {
      uVar17 = 0;
    }
    else {
      uVar11 = 0;
      uVar17 = 0;
      do {
        sVar9 = strlen(*(char **)(lVar12 + uVar11 * 8));
        uVar14 = sVar9 & 0xffffffff;
        if ((int)sVar9 < (int)uVar17) {
          uVar14 = uVar17;
        }
        uVar17 = uVar14;
        uVar11 = uVar11 + 1;
      } while (uVar4 != uVar11);
    }
    iVar6 = (int)uVar17;
    values_00 = malloc((long)(int)(iVar6 * uVar4));
    if (values_00 == (void *)0x0) {
      iVar6 = -2;
    }
    else {
      if (0 < (int)uVar4) {
        uVar11 = 0;
        pvVar16 = values_00;
        do {
          pcVar2 = *(char **)(lVar12 + uVar11 * 8);
          cVar10 = *pcVar2;
          uVar14 = 0;
          if (cVar10 != '\0') {
            uVar14 = 0;
            do {
              *(char *)((long)pvVar16 + uVar14) = cVar10;
              cVar10 = pcVar2[uVar14 + 1];
              uVar14 = uVar14 + 1;
            } while (cVar10 != '\0');
          }
          if ((int)(uint)uVar14 < iVar6) {
            memset((void *)((long)values_00 + (uVar14 & 0xffffffff) + (long)(iVar6 * (int)uVar11)),0
                   ,(ulong)(~(uint)uVar14 + iVar6) + 1);
          }
          uVar11 = uVar11 + 1;
          pvVar16 = (void *)((long)pvVar16 + uVar17);
        } while (uVar11 != uVar4);
      }
      iVar6 = bcf_update_format(hdr_00,line_00,key_00,values_00,iVar6 * uVar4,3);
      free(values_00);
    }
    return iVar6;
  }
  if (pbVar15 != (bcf_info_t *)0x0) {
    uVar4 = *(uint *)&pbVar15->field_0x1c & 0x7fffffff;
    uVar17 = (ulong)(pbVar15->vptr_len + uVar4);
    if (local_48.l <= uVar17) {
      if (local_48.l != uVar17) {
        piVar1 = &(line->d).shared_dirty;
        *(byte *)piVar1 = (byte)*piVar1 | 8;
        uVar4 = *(uint *)&pbVar15->field_0x1c & 0x7fffffff;
      }
      pbVar20 = pbVar15->vptr + -(ulong)uVar4;
      memcpy(pbVar20,local_48.s,local_48.l);
      free(local_48.s);
      if ((*pbVar20 & 0xf) == 2) {
        pbVar13 = pbVar20 + 3;
        iVar6 = (int)*(short *)(pbVar20 + 1);
      }
      else if ((*pbVar20 & 0xf) == 1) {
        pbVar13 = pbVar20 + 2;
        iVar6 = (int)(char)pbVar20[1];
      }
      else {
        pbVar13 = pbVar20 + 5;
        iVar6 = *(int *)(pbVar20 + 1);
      }
      uVar4 = *(uint *)&pbVar15->field_0x1c;
      pbVar15->key = iVar6;
      uVar3 = *pbVar13 & 0xf;
      pbVar15->type = uVar3;
      if (*pbVar13 < 0xf0) {
        paVar8 = (anon_union_4_2_947300a4_for_v1 *)(pbVar13 + 1);
        uVar19 = (uint)(*pbVar13 >> 4);
      }
      else if ((pbVar13[1] & 0xf) == 2) {
        uVar19 = (uint)*(short *)(pbVar13 + 2);
        paVar8 = (anon_union_4_2_947300a4_for_v1 *)(pbVar13 + 4);
      }
      else if ((pbVar13[1] & 0xf) == 1) {
        uVar19 = (uint)(char)pbVar13[2];
        paVar8 = (anon_union_4_2_947300a4_for_v1 *)(pbVar13 + 3);
      }
      else {
        uVar19 = *(uint *)(pbVar13 + 2);
        paVar8 = (anon_union_4_2_947300a4_for_v1 *)(pbVar13 + 6);
      }
      pbVar15->len = uVar19;
      pbVar15->vptr = (uint8_t *)paVar8;
      uVar18 = (int)paVar8 - (int)pbVar20 & 0x7fffffff;
      *(uint *)&pbVar15->field_0x1c = uVar18;
      (pbVar15->v1).i = 0;
      if (uVar19 != 1) goto switchD_0011fa32_caseD_4;
      switch(uVar3) {
      case 1:
      case 7:
        aVar5 = (anon_union_4_2_947300a4_for_v1)(int)(char)*(byte *)paVar8;
        break;
      case 2:
        aVar5 = (anon_union_4_2_947300a4_for_v1)(int)*(short *)paVar8;
        break;
      case 3:
        aVar5 = *paVar8;
        break;
      default:
        goto switchD_0011fa32_caseD_4;
      case 5:
        pbVar15->v1 = *paVar8;
        goto switchD_0011fa32_caseD_4;
      }
      pbVar15->v1 = aVar5;
switchD_0011fa32_caseD_4:
      pbVar15->vptr_len = uVar19 << (bcf_type_shift[uVar3] & 0x1f);
      *(uint *)&pbVar15->field_0x1c = uVar18 | uVar4 & 0x80000000;
      goto LAB_0011fb19;
    }
    if ((int)*(uint *)&pbVar15->field_0x1c < 0) {
      __assert_fail("!inf->vptr_free",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                    ,0xa95,
                    "int bcf_update_info(const bcf_hdr_t *, bcf1_t *, const char *, const void *, int, int)"
                   );
    }
    if ((*local_48.s & 0xfU) == 2) {
      pbVar20 = (byte *)(local_48.s + 3);
      iVar6 = (int)*(short *)(local_48.s + 1);
    }
    else if ((*local_48.s & 0xfU) == 1) {
      pbVar20 = (byte *)(local_48.s + 2);
      iVar6 = (int)local_48.s[1];
    }
    else {
      pbVar20 = (byte *)(local_48.s + 5);
      iVar6 = *(int *)(local_48.s + 1);
    }
    pbVar15->key = iVar6;
    uVar4 = *pbVar20 & 0xf;
    pbVar15->type = uVar4;
    if (*pbVar20 < 0xf0) {
      paVar8 = (anon_union_4_2_947300a4_for_v1 *)(pbVar20 + 1);
      uVar3 = (uint)(*pbVar20 >> 4);
    }
    else if ((pbVar20[1] & 0xf) == 2) {
      uVar3 = (uint)*(short *)(pbVar20 + 2);
      paVar8 = (anon_union_4_2_947300a4_for_v1 *)(pbVar20 + 4);
    }
    else if ((pbVar20[1] & 0xf) == 1) {
      uVar3 = (uint)(char)pbVar20[2];
      paVar8 = (anon_union_4_2_947300a4_for_v1 *)(pbVar20 + 3);
    }
    else {
      uVar3 = *(uint *)(pbVar20 + 2);
      paVar8 = (anon_union_4_2_947300a4_for_v1 *)(pbVar20 + 6);
    }
    pbVar15->len = uVar3;
    pbVar15->vptr = (uint8_t *)paVar8;
    uVar19 = (int)paVar8 - (int)local_48.s;
    *(uint *)&pbVar15->field_0x1c = uVar19 & 0x7fffffff;
    (pbVar15->v1).i = 0;
    if (uVar3 != 1) goto switchD_0011fa8c_caseD_4;
    switch(uVar4) {
    case 1:
    case 7:
      aVar5 = (anon_union_4_2_947300a4_for_v1)(int)(char)*(byte *)paVar8;
      break;
    case 2:
      aVar5 = (anon_union_4_2_947300a4_for_v1)(int)*(short *)paVar8;
      break;
    case 3:
      aVar5 = *paVar8;
      break;
    default:
      goto switchD_0011fa8c_caseD_4;
    case 5:
      pbVar15->v1 = *paVar8;
      goto switchD_0011fa8c_caseD_4;
    }
    pbVar15->v1 = aVar5;
switchD_0011fa8c_caseD_4:
    pbVar15->vptr_len = uVar3 << (bcf_type_shift[uVar4] & 0x1f);
    *(uint *)&pbVar15->field_0x1c = uVar19 | 0x80000000;
    goto LAB_0011fb11;
  }
  uVar4 = *(int *)&line->field_0x10 + 1;
  uVar3 = uVar4 & 0xffff;
  *(short *)&line->field_0x10 = (short)uVar4;
  iVar6 = (line->d).m_info;
  if (iVar6 < (int)uVar3) {
    uVar4 = (int)(uVar3 - 1) >> 1 | uVar3 - 1;
    uVar4 = (int)uVar4 >> 2 | uVar4;
    uVar4 = (int)uVar4 >> 4 | uVar4;
    uVar4 = (int)uVar4 >> 8 | uVar4;
    uVar4 = (int)uVar4 >> 0x10 | uVar4;
    (line->d).m_info = uVar4 + 1;
    pbVar7 = (bcf_info_t *)realloc((line->d).info,(long)(int)uVar4 * 0x20 + 0x20);
    (line->d).info = pbVar7;
    memset(pbVar7 + iVar6,0,((long)(line->d).m_info - (long)iVar6) * 0x20);
    uVar3 = (uint)*(ushort *)&line->field_0x10;
  }
  else {
    pbVar7 = (line->d).info;
  }
  uVar3 = uVar3 << 5;
  if ((*local_48.s & 0xfU) == 2) {
    pbVar20 = (byte *)(local_48.s + 3);
    iVar6 = (int)*(short *)(local_48.s + 1);
  }
  else if ((*local_48.s & 0xfU) == 1) {
    pbVar20 = (byte *)(local_48.s + 2);
    iVar6 = (int)local_48.s[1];
  }
  else {
    pbVar20 = (byte *)(local_48.s + 5);
    iVar6 = *(int *)(local_48.s + 1);
  }
  *(int *)((long)&pbVar7[-1].key + (ulong)uVar3) = iVar6;
  uVar4 = *pbVar20 & 0xf;
  *(uint *)((long)pbVar7 + ((ulong)uVar3 - 0x1c)) = uVar4;
  if (*pbVar20 < 0xf0) {
    pbVar13 = pbVar20 + 1;
    uVar19 = (uint)(*pbVar20 >> 4);
  }
  else if ((pbVar20[1] & 0xf) == 2) {
    uVar19 = (uint)*(short *)(pbVar20 + 2);
    pbVar13 = pbVar20 + 4;
  }
  else if ((pbVar20[1] & 0xf) == 1) {
    uVar19 = (uint)(char)pbVar20[2];
    pbVar13 = pbVar20 + 3;
  }
  else {
    uVar19 = *(uint *)(pbVar20 + 2);
    pbVar13 = pbVar20 + 6;
  }
  *(uint *)((long)pbVar7 + ((ulong)uVar3 - 0x18)) = uVar19;
  *(byte **)((long)pbVar7 + ((ulong)uVar3 - 0x10)) = pbVar13;
  uVar18 = (int)pbVar13 - (int)local_48.s;
  *(uint *)((long)pbVar7 + ((ulong)uVar3 - 4)) = uVar18 & 0x7fffffff;
  *(undefined4 *)((long)pbVar7 + ((ulong)uVar3 - 0x14)) = 0;
  if (uVar19 != 1) goto switchD_0011f9d3_caseD_4;
  switch(uVar4) {
  case 1:
  case 7:
    iVar6 = (int)(char)*pbVar13;
    break;
  case 2:
    iVar6 = (int)*(short *)pbVar13;
    break;
  case 3:
    iVar6 = *(int *)pbVar13;
    break;
  default:
    goto switchD_0011f9d3_caseD_4;
  case 5:
    *(undefined4 *)((long)pbVar7 + ((ulong)uVar3 - 0x14)) = *(undefined4 *)pbVar13;
    goto switchD_0011f9d3_caseD_4;
  }
  *(int *)((long)pbVar7 + ((ulong)uVar3 - 0x14)) = iVar6;
switchD_0011f9d3_caseD_4:
  *(uint *)((long)pbVar7 + ((ulong)uVar3 - 8)) = uVar19 << (bcf_type_shift[uVar4] & 0x1f);
  *(uint *)((long)pbVar7 + ((ulong)uVar3 - 4)) = uVar18 | 0x80000000;
LAB_0011fb11:
  piVar1 = &(line->d).shared_dirty;
  *(byte *)piVar1 = (byte)*piVar1 | 8;
LAB_0011fb19:
  *(byte *)&line->unpacked = (byte)line->unpacked | 4;
  return 0;
}

Assistant:

int bcf_update_info(const bcf_hdr_t *hdr, bcf1_t *line, const char *key, const void *values, int n, int type)
{
    // Is the field already present?
    int i, inf_id = bcf_hdr_id2int(hdr,BCF_DT_ID,key);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_INFO,inf_id) ) return -1;    // No such INFO field in the header
    if ( !(line->unpacked & BCF_UN_INFO) ) bcf_unpack(line, BCF_UN_INFO);

    for (i=0; i<line->n_info; i++)
        if ( inf_id==line->d.info[i].key ) break;
    bcf_info_t *inf = i==line->n_info ? NULL : &line->d.info[i];

    if ( !n || (type==BCF_HT_STR && !values) )
    {
        if ( inf )
        {
            // Mark the tag for removal, free existing memory if necessary
            if ( inf->vptr_free )
            {
                free(inf->vptr - inf->vptr_off);
                inf->vptr_free = 0;
            }
            line->d.shared_dirty |= BCF1_DIRTY_INF;
            inf->vptr = NULL;
        }
        return 0;
    }

    // Encode the values and determine the size required to accommodate the values
    kstring_t str = {0,0,0};
    bcf_enc_int1(&str, inf_id);
    if ( type==BCF_HT_INT )
        bcf_enc_vint(&str, n, (int32_t*)values, -1);
    else if ( type==BCF_HT_REAL )
        bcf_enc_vfloat(&str, n, (float*)values);
    else if ( type==BCF_HT_FLAG || type==BCF_HT_STR )
    {
        if ( values==NULL )
            bcf_enc_size(&str, 0, BCF_BT_NULL);
        else
            bcf_enc_vchar(&str, strlen((char*)values), (char*)values);
    }
    else
    {
        fprintf(stderr, "[E::%s] the type %d not implemented yet\n", __func__, type);
        abort();
    }

    // Is the INFO tag already present
    if ( inf )
    {
        // Is it big enough to accommodate new block?
        if ( str.l <= inf->vptr_len + inf->vptr_off )
        {
            if ( str.l != inf->vptr_len + inf->vptr_off ) line->d.shared_dirty |= BCF1_DIRTY_INF;
            uint8_t *ptr = inf->vptr - inf->vptr_off;
            memcpy(ptr, str.s, str.l);
            free(str.s);
            int vptr_free = inf->vptr_free;
            bcf_unpack_info_core1(ptr, inf);
            inf->vptr_free = vptr_free;
        }
        else
        {
            assert( !inf->vptr_free );  // fix the caller or improve here: this has been modified before
            bcf_unpack_info_core1((uint8_t*)str.s, inf);
            inf->vptr_free = 1;
            line->d.shared_dirty |= BCF1_DIRTY_INF;
        }
    }
    else
    {
        // The tag is not present, create new one
        line->n_info++;
        hts_expand0(bcf_info_t, line->n_info, line->d.m_info , line->d.info);
        inf = &line->d.info[line->n_info-1];
        bcf_unpack_info_core1((uint8_t*)str.s, inf);
        inf->vptr_free = 1;
        line->d.shared_dirty |= BCF1_DIRTY_INF;
    }
    line->unpacked |= BCF_UN_INFO;
    return 0;
}